

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

void duckdb::RadixSortMSD
               (data_ptr_t orig_ptr,data_ptr_t temp_ptr,idx_t *count,idx_t *col_offset,
               idx_t *row_width,idx_t *comp_width,idx_t *offset,idx_t *locations,bool swap)

{
  byte *pbVar1;
  long lVar2;
  idx_t iVar3;
  idx_t i_1;
  ulong uVar4;
  long lVar5;
  data_ptr_t row_ptr;
  data_ptr_t src;
  idx_t i;
  ulong uVar6;
  idx_t local_50;
  idx_t local_48;
  data_ptr_t local_40;
  long local_38;
  
  src = orig_ptr;
  if (swap) {
    src = temp_ptr;
  }
  switchD_0049f7f1::default(locations,0,0x808);
  local_38 = *offset + *col_offset;
  pbVar1 = src + local_38;
  for (uVar6 = 0; uVar6 < *count; uVar6 = uVar6 + 1) {
    locations[(ulong)*pbVar1 + 1] = locations[(ulong)*pbVar1 + 1] + 1;
    pbVar1 = pbVar1 + *row_width;
  }
  uVar6 = 0;
  for (lVar2 = 1; lVar2 != 0x101; lVar2 = lVar2 + 1) {
    uVar4 = locations[lVar2];
    if (uVar6 <= uVar4) {
      uVar6 = uVar4;
    }
    locations[lVar2] = uVar4 + locations[lVar2 + -1];
  }
  local_40 = temp_ptr;
  if (swap) {
    local_40 = orig_ptr;
  }
  iVar3 = *count;
  uVar4 = uVar6;
  if (uVar6 != iVar3) {
    for (uVar4 = 0; uVar4 < iVar3; uVar4 = uVar4 + 1) {
      iVar3 = locations[src[local_38]];
      locations[src[local_38]] = iVar3 + 1;
      FastMemcpy(local_40 + iVar3 * *row_width,src,*row_width);
      src = src + *row_width;
      iVar3 = *count;
    }
    swap = !swap;
    uVar4 = iVar3;
  }
  if (*offset == *comp_width - 1) {
    if (swap != false) {
      switchD_00916250::default(orig_ptr,temp_ptr,uVar4 * *row_width);
      return;
    }
  }
  else if (uVar6 == uVar4) {
    local_48 = *offset + 1;
    RadixSortMSD(orig_ptr,temp_ptr,count,col_offset,row_width,comp_width,&local_48,locations + 0x101
                 ,swap);
  }
  else {
    local_48 = *locations;
    uVar6 = local_48;
    for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
      lVar5 = (uVar6 - local_48) * *row_width;
      if (local_48 < 0x19) {
        if (local_48 != 0) {
          local_50 = *offset + 1;
          InsertionSort(orig_ptr + lVar5,temp_ptr + lVar5,&local_48,col_offset,row_width,comp_width,
                        &local_50,swap);
        }
      }
      else {
        local_50 = *offset + 1;
        RadixSortMSD(orig_ptr + lVar5,temp_ptr + lVar5,&local_48,col_offset,row_width,comp_width,
                     &local_50,locations + 0x101,swap);
      }
      uVar6 = locations[lVar2 + 1];
      local_48 = uVar6 - locations[lVar2];
    }
  }
  return;
}

Assistant:

void RadixSortMSD(const data_ptr_t orig_ptr, const data_ptr_t temp_ptr, const idx_t &count, const idx_t &col_offset,
                  const idx_t &row_width, const idx_t &comp_width, const idx_t &offset, idx_t locations[], bool swap) {
	const data_ptr_t source_ptr = swap ? temp_ptr : orig_ptr;
	const data_ptr_t target_ptr = swap ? orig_ptr : temp_ptr;
	// Init counts to 0
	memset(locations, 0, SortConstants::MSD_RADIX_LOCATIONS * sizeof(idx_t));
	idx_t *counts = locations + 1;
	// Collect counts
	const idx_t total_offset = col_offset + offset;
	data_ptr_t offset_ptr = source_ptr + total_offset;
	for (idx_t i = 0; i < count; i++) {
		counts[*offset_ptr]++;
		offset_ptr += row_width;
	}
	// Compute locations from counts
	idx_t max_count = 0;
	for (idx_t radix = 0; radix < SortConstants::VALUES_PER_RADIX; radix++) {
		max_count = MaxValue<idx_t>(max_count, counts[radix]);
		counts[radix] += locations[radix];
	}
	if (max_count != count) {
		// Re-order the data in temporary array
		data_ptr_t row_ptr = source_ptr;
		for (idx_t i = 0; i < count; i++) {
			const idx_t &radix_offset = locations[*(row_ptr + total_offset)]++;
			FastMemcpy(target_ptr + radix_offset * row_width, row_ptr, row_width);
			row_ptr += row_width;
		}
		swap = !swap;
	}
	// Check if done
	if (offset == comp_width - 1) {
		if (swap) {
			memcpy(orig_ptr, temp_ptr, count * row_width);
		}
		return;
	}
	if (max_count == count) {
		RadixSortMSD(orig_ptr, temp_ptr, count, col_offset, row_width, comp_width, offset + 1,
		             locations + SortConstants::MSD_RADIX_LOCATIONS, swap);
		return;
	}
	// Recurse
	idx_t radix_count = locations[0];
	for (idx_t radix = 0; radix < SortConstants::VALUES_PER_RADIX; radix++) {
		const idx_t loc = (locations[radix] - radix_count) * row_width;
		if (radix_count > SortConstants::INSERTION_SORT_THRESHOLD) {
			RadixSortMSD(orig_ptr + loc, temp_ptr + loc, radix_count, col_offset, row_width, comp_width, offset + 1,
			             locations + SortConstants::MSD_RADIX_LOCATIONS, swap);
		} else if (radix_count != 0) {
			InsertionSort(orig_ptr + loc, temp_ptr + loc, radix_count, col_offset, row_width, comp_width, offset + 1,
			              swap);
		}
		radix_count = locations[radix + 1] - locations[radix];
	}
}